

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_topology.cpp
# Opt level: O0

int ON__MeshFaceSide_compare_m_vi(ON_MeshFaceSide *side1,ON_MeshFaceSide *side2)

{
  ON_MeshFaceSide *side2_local;
  ON_MeshFaceSide *side1_local;
  
  if (side1->m_vi[0] < side2->m_vi[0]) {
    side1_local._4_4_ = -1;
  }
  else if (side2->m_vi[0] < side1->m_vi[0]) {
    side1_local._4_4_ = 1;
  }
  else if (side1->m_vi[1] < side2->m_vi[1]) {
    side1_local._4_4_ = -1;
  }
  else if (side2->m_vi[1] < side1->m_vi[1]) {
    side1_local._4_4_ = 1;
  }
  else if (side1->m_fi < side2->m_fi) {
    side1_local._4_4_ = -1;
  }
  else if (side2->m_fi < side1->m_fi) {
    side1_local._4_4_ = 1;
  }
  else if (side1->m_side < side2->m_side) {
    side1_local._4_4_ = -1;
  }
  else if (side2->m_side < side1->m_side) {
    side1_local._4_4_ = 1;
  }
  else if (side1->m_dir < side2->m_dir) {
    side1_local._4_4_ = -1;
  }
  else if (side2->m_dir < side1->m_dir) {
    side1_local._4_4_ = 1;
  }
  else {
    side1_local._4_4_ = 0;
  }
  return side1_local._4_4_;
}

Assistant:

static int ON_SORT_TEMPLATE_COMPARE( 
        ON_SORT_TEMPLATE_TYPE const * side1, 
        ON_SORT_TEMPLATE_TYPE const * side2 
        )
{
  if ( side1->m_vi[0] < side2->m_vi[0] )
    return -1;
  if ( side1->m_vi[0] > side2->m_vi[0] )
    return 1;
  if ( side1->m_vi[1] < side2->m_vi[1] )
    return -1;
  if ( side1->m_vi[1] > side2->m_vi[1] )
    return 1;
  if ( side1->m_fi < side2->m_fi )
    return -1;
  if ( side1->m_fi > side2->m_fi )
    return 1;
  if ( side1->m_side < side2->m_side )
    return -1;
  if ( side1->m_side > side2->m_side )
    return 1;
  if ( side1->m_dir < side2->m_dir )
    return -1;
  if ( side1->m_dir > side2->m_dir )
    return 1;
  return 0;
}